

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

bool __thiscall
HighsDomain::ConflictSet::explainInfeasibilityLeq
          (ConflictSet *this,HighsInt *inds,double *vals,HighsInt len,double rhs,double minAct)

{
  int col;
  pointer pRVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  pointer pdVar3;
  bool bVar4;
  NodeSetArray *pNVar5;
  ulong uVar6;
  HighsInt stackpos;
  long lVar7;
  ulong uVar8;
  double dVar9;
  HighsCDouble M;
  value_type local_90;
  double local_70;
  NodeSetArray *local_68;
  NodeSetArray *local_60;
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  *local_58;
  double local_50;
  double local_48;
  
  if (minAct <= -INFINITY) {
    return false;
  }
  stackpos = 0x7fffffff;
  if (this->localdom->infeasible_ == true) {
    stackpos = this->localdom->infeasible_pos;
  }
  local_58 = &this->resolveBuffer;
  local_70 = minAct;
  local_48 = rhs;
  std::
  vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
  ::reserve(local_58,(long)len);
  pRVar1 = (this->resolveBuffer).
           super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolveBuffer).
      super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar1) {
    (this->resolveBuffer).
    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  _Var2._M_head_impl =
       (this->localdom->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_68 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x48);
  local_60 = (NodeSetArray *)((long)&(_Var2._M_head_impl)->nodequeue + 0x40);
  uVar6 = 0;
  uVar8 = (ulong)(uint)len;
  if (len < 1) {
    uVar8 = uVar6;
  }
  do {
    if (uVar8 == uVar6) {
      pdqsort<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::ResolveCandidate*,std::vector<HighsDomain::ConflictSet::ResolveCandidate,std::allocator<HighsDomain::ConflictSet::ResolveCandidate>>>,std::less<HighsDomain::ConflictSet::ResolveCandidate>>
                ((this->resolveBuffer).
                 super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->resolveBuffer).
                 super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      dVar9 = ABS(local_48);
      if (dVar9 <= 10.0) {
        dVar9 = 10.0;
      }
      M.lo = 0.0;
      M.hi = local_70;
      bVar4 = resolveLinearLeq(this,M,dVar9 * ((this->localdom->mipsolver->mipdata_)._M_t.
                                               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                               .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                              _M_head_impl)->feastol + local_48,vals);
      return bVar4;
    }
    col = inds[uVar6];
    lVar7 = (long)col;
    local_90.valuePos = (HighsInt)uVar6;
    local_50 = vals[uVar6];
    if (local_50 <= 0.0) {
      dVar9 = getColUpperPos(this->localdom,col,stackpos,&local_90.boundPos);
      pdVar3 = (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_90.baseBound = pdVar3[lVar7];
      if ((dVar9 < local_90.baseBound) && (local_90.boundPos != -1)) {
        local_90.delta = dVar9 - local_90.baseBound;
        pNVar5 = local_68;
        goto LAB_002a75ce;
      }
    }
    else {
      dVar9 = getColLowerPos(this->localdom,col,stackpos,&local_90.boundPos);
      pdVar3 = (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_90.baseBound = pdVar3[lVar7];
      if ((local_90.baseBound < dVar9) && (local_90.boundPos != -1)) {
        local_90.delta = dVar9 - local_90.baseBound;
        pNVar5 = local_60;
LAB_002a75ce:
        local_90.delta = local_90.delta * local_50;
        local_90.prio =
             ABS((double)(*(long *)((long)pNVar5->_M_t + 0x30 + lVar7 * 0x38) + 1) *
                 (dVar9 - pdVar3[lVar7]) * local_50);
        std::
        vector<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
        ::push_back(local_58,&local_90);
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool HighsDomain::ConflictSet::explainInfeasibilityLeq(const HighsInt* inds,
                                                       const double* vals,
                                                       HighsInt len, double rhs,
                                                       double minAct) {
  if (minAct == -kHighsInf) return false;

  HighsInt infeasible_pos = kHighsIInf;
  if (localdom.infeasible_) infeasible_pos = localdom.infeasible_pos;

  resolveBuffer.reserve(len);
  resolveBuffer.clear();
  const auto& nodequeue = localdom.mipsolver->mipdata_->nodequeue;
  for (HighsInt i = 0; i < len; ++i) {
    HighsInt col = inds[i];

    ResolveCandidate cand;
    cand.valuePos = i;

    if (vals[i] > 0) {
      double lb = localdom.getColLowerPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_lower_[col];
      if (cand.baseBound >= lb || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (lb - cand.baseBound);
      cand.prio = computePrio(vals[i], lb, globaldom.col_lower_[col],
                              nodequeue.numNodesUp(col));
    } else {
      double ub = localdom.getColUpperPos(col, infeasible_pos, cand.boundPos);
      cand.baseBound = globaldom.col_upper_[col];
      if (cand.baseBound <= ub || cand.boundPos == -1) continue;
      cand.delta = vals[i] * (ub - cand.baseBound);
      cand.prio = computePrio(vals[i], ub, globaldom.col_upper_[col],
                              nodequeue.numNodesDown(col));
    }

    resolveBuffer.push_back(cand);
  }

  pdqsort(resolveBuffer.begin(), resolveBuffer.end());

  // compute the lower bound of M that is necessary
  double Mlower = rhs + std::max(10.0, std::fabs(rhs)) *
                            localdom.mipsolver->mipdata_->feastol;

  return resolveLinearLeq(minAct, Mlower, vals);
}